

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O1

BBox * __thiscall CMU462::DynamicScene::Sphere::get_bbox(Sphere *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  BBox *in_RDI;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = this->r;
  dVar5 = (this->p).x;
  dVar6 = dVar5 - dVar1;
  dVar5 = dVar5 + dVar1;
  (in_RDI->max).z = 0.0;
  (in_RDI->min).x = 0.0;
  (in_RDI->max).x = 0.0;
  (in_RDI->max).y = 0.0;
  (in_RDI->extent).x = 0.0;
  (in_RDI->extent).y = 0.0;
  (in_RDI->min).y = 0.0;
  (in_RDI->min).z = 0.0;
  (in_RDI->extent).z = 0.0;
  (in_RDI->min).x = dVar6;
  (in_RDI->max).x = dVar5;
  dVar3 = (this->p).y;
  dVar4 = (this->p).z;
  dVar7 = dVar1 + dVar3;
  dVar8 = dVar1 + dVar4;
  dVar3 = dVar3 - dVar1;
  dVar4 = dVar4 - dVar1;
  auVar2._8_4_ = SUB84(dVar4,0);
  auVar2._0_8_ = dVar3;
  auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
  (in_RDI->min).y = dVar3;
  (in_RDI->min).z = (double)auVar2._8_8_;
  (in_RDI->max).y = dVar7;
  (in_RDI->max).z = dVar8;
  (in_RDI->extent).x = dVar5 - dVar6;
  (in_RDI->extent).y = dVar7 - dVar3;
  (in_RDI->extent).z = dVar8 - dVar4;
  return in_RDI;
}

Assistant:

BBox Sphere::get_bbox() {
  return BBox(p.x - r, p.y - r, p.z - r, p.x + r, p.y + r, p.z + r);
}